

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O3

Gia_Man_t * Gia_ManStgRead(char *pFileName,int kHot,int fVerbose)

{
  Vec_Int_t *vLines;
  Gia_Man_t *pGVar1;
  int nStates;
  int nOuts;
  int nIns;
  int local_24;
  int local_20;
  int local_1c;
  
  vLines = Gia_ManStgReadLines(pFileName,&local_1c,&local_20,&local_24);
  if (vLines == (Vec_Int_t *)0x0) {
    pGVar1 = (Gia_Man_t *)0x0;
  }
  else {
    pGVar1 = Gia_ManStgKHot(vLines,local_1c,local_20,local_24,kHot,fVerbose);
    if (vLines->pArray != (int *)0x0) {
      free(vLines->pArray);
    }
    free(vLines);
  }
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManStgRead( char * pFileName, int kHot, int fVerbose )
{
    Gia_Man_t * p;
    Vec_Int_t * vLines;
    int nIns, nOuts, nStates;
    vLines = Gia_ManStgReadLines( pFileName, &nIns, &nOuts, &nStates );
    if ( vLines == NULL )
        return NULL;
//    p = Gia_ManStgOneHot( vLines, nIns, nOuts, nStates );
    p = Gia_ManStgKHot( vLines, nIns, nOuts, nStates, kHot, fVerbose );
    Vec_IntFree( vLines );
    return p;
}